

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_multi_closed(Curl_easy *data,curl_socket_t s)

{
  Curl_hash *h;
  Curl_multi *pCVar1;
  int iVar2;
  Curl_hash *h_00;
  curl_socket_t local_3c;
  curl_socket_t local_38;
  curl_socket_t local_34;
  
  if ((data != (Curl_easy *)0x0) && (pCVar1 = data->multi, pCVar1 != (Curl_multi *)0x0)) {
    h = &pCVar1->sockhash;
    local_3c = s;
    if (s == -1) {
      h_00 = (Curl_hash *)0x0;
    }
    else {
      h_00 = (Curl_hash *)Curl_hash_pick(h,&local_3c,4);
    }
    if (h_00 != (Curl_hash *)0x0) {
      if (pCVar1->socket_cb == (curl_socket_callback)0x0) {
        local_34 = s;
        Curl_hash_destroy(h_00);
        Curl_hash_delete(h,&local_34,4);
      }
      else {
        pCVar1->field_0x1b1 = pCVar1->field_0x1b1 | 4;
        iVar2 = (*pCVar1->socket_cb)(data,s,4,pCVar1->socket_userp,h_00[1].hash_func);
        pCVar1->field_0x1b1 = pCVar1->field_0x1b1 & 0xfb;
        local_38 = s;
        Curl_hash_destroy(h_00);
        Curl_hash_delete(h,&local_38,4);
        if (iVar2 == -1) {
          pCVar1->field_0x1b1 = pCVar1->field_0x1b1 | 0x10;
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_multi_closed(struct Curl_easy *data, curl_socket_t s)
{
  if(data) {
    /* if there's still an easy handle associated with this connection */
    struct Curl_multi *multi = data->multi;
    if(multi) {
      /* this is set if this connection is part of a handle that is added to
         a multi handle, and only then this is necessary */
      struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

      if(entry) {
        int rc = 0;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
        }

        /* now remove it from the socket hash */
        sh_delentry(entry, &multi->sockhash, s);
        if(rc == -1)
          /* This just marks the multi handle as "dead" without returning an
             error code primarily because this function is used from many
             places where propagating an error back is tricky. */
          multi->dead = TRUE;
      }
    }
  }
}